

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

byte __thiscall TTD::TextFormatReader::ReadNakedByte(TextFormatReader *this,bool readSeparator)

{
  ParseTokenKind PVar1;
  char16_t *buff;
  uint64 uVar2;
  undefined8 in_RDX;
  uint64 uval;
  ParseTokenKind tok;
  bool readSeparator_local;
  TextFormatReader *this_local;
  
  (*(this->super_FileReader)._vptr_FileReader[2])(this,(ulong)readSeparator,in_RDX,readSeparator);
  PVar1 = Scan(this,&this->m_charListOpt);
  if (PVar1 != Number) {
    TTDAbort_unrecoverable_error("Error in parse.");
  }
  buff = JsUtil::ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>::GetBuffer
                   (&(this->m_charListOpt).
                     super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>);
  uVar2 = ReadUIntFromCharArray(this,buff);
  if (0xff < uVar2) {
    TTDAbort_unrecoverable_error("Error in parse.");
  }
  return (byte)uVar2;
}

Assistant:

byte TextFormatReader::ReadNakedByte(bool readSeparator)
    {
        this->ReadSeparator(readSeparator);

        NSTokens::ParseTokenKind tok = this->Scan(this->m_charListOpt);
        TTDAssert(tok == NSTokens::ParseTokenKind::Number, "Error in parse.");

        uint64 uval = this->ReadUIntFromCharArray(this->m_charListOpt.GetBuffer());
        TTDAssert(uval <= BYTE_MAX, "Error in parse.");

        return (byte)uval;
    }